

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O0

void inc_value_slot(Am_Slot_Key slot,Am_Value *inc_value,Am_Object *obj,Am_Object *command_obj)

{
  int inc;
  ostream *poVar1;
  float inc_00;
  Am_Object *command_obj_local;
  Am_Object *obj_local;
  Am_Value *inc_value_local;
  Am_Slot_Key slot_local;
  
  if (inc_value->type == 2) {
    inc = Am_Value::operator_cast_to_int(inc_value);
    inc_int_value(obj,slot,inc,command_obj);
  }
  else {
    if (inc_value->type != 5) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar1 = std::operator<<(poVar1,
                               "Am_SMALL_INCREMENT should be of type int or float, but it is ");
      poVar1 = operator<<(poVar1,inc_value);
      poVar1 = std::operator<<(poVar1," in ");
      poVar1 = operator<<(poVar1,command_obj);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    inc_00 = Am_Value::operator_cast_to_float(inc_value);
    inc_float_value(obj,slot,inc_00,command_obj);
  }
  return;
}

Assistant:

void
inc_value_slot(Am_Slot_Key slot, Am_Value inc_value, Am_Object &obj,
               Am_Object &command_obj)
{
  if (inc_value.type == Am_INT)
    inc_int_value(obj, slot, (int)inc_value, command_obj);
  else if (inc_value.type == Am_FLOAT)
    inc_float_value(obj, slot, (float)inc_value, command_obj);
  else
    Am_ERROR("Am_SMALL_INCREMENT should be of type int or float, but it is "
             << inc_value << " in " << command_obj);
}